

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O1

Constant *
spvtools::opt::anon_unknown_0::FoldFPScalarDivideByZero
          (Type *result_type,Constant *numerator,ConstantManager *const_mgr)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  Constant *pCVar4;
  undefined4 extraout_var_00;
  double dVar5;
  long lVar3;
  
  if (numerator == (Constant *)0x0) {
    return (Constant *)0x0;
  }
  iVar1 = (*numerator->_vptr_Constant[0x17])(numerator);
  iVar2 = (*result_type->_vptr_Type[0xc])(result_type);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if ((char)iVar1 != '\0') {
    if (lVar3 == 0) {
      return (Constant *)0x0;
    }
    if (*(int *)(lVar3 + 0x24) != 0x40) {
      if (*(int *)(lVar3 + 0x24) != 0x20) {
        return (Constant *)0x0;
      }
      pCVar4 = analysis::ConstantManager::GetFloatConst(const_mgr,NAN);
      return pCVar4;
    }
    pCVar4 = analysis::ConstantManager::GetDoubleConst(const_mgr,NAN);
    return pCVar4;
  }
  if (lVar3 != 0) {
    if (*(int *)(lVar3 + 0x24) == 0x40) {
      pCVar4 = analysis::ConstantManager::GetDoubleConst(const_mgr,INFINITY);
      goto LAB_001da022;
    }
    if (*(int *)(lVar3 + 0x24) == 0x20) {
      pCVar4 = analysis::ConstantManager::GetFloatConst(const_mgr,INFINITY);
      goto LAB_001da022;
    }
  }
  pCVar4 = (Constant *)0x0;
LAB_001da022:
  if (pCVar4 == (Constant *)0x0) {
    return (Constant *)0x0;
  }
  iVar1 = (*numerator->_vptr_Constant[0xf])(numerator);
  dVar5 = analysis::Constant::GetValueAsDouble((Constant *)CONCAT44(extraout_var_00,iVar1));
  if (dVar5 < 0.0) {
    pCVar4 = NegateFPConst(result_type,pCVar4,const_mgr);
    return pCVar4;
  }
  return pCVar4;
}

Assistant:

const analysis::Constant* FoldFPScalarDivideByZero(
    const analysis::Type* result_type, const analysis::Constant* numerator,
    analysis::ConstantManager* const_mgr) {
  if (numerator == nullptr) {
    return nullptr;
  }

  if (numerator->IsZero()) {
    return GetNan(result_type, const_mgr);
  }

  const analysis::Constant* result = GetInf(result_type, const_mgr);
  if (result == nullptr) {
    return nullptr;
  }

  if (numerator->AsFloatConstant()->GetValueAsDouble() < 0.0) {
    result = NegateFPConst(result_type, result, const_mgr);
  }
  return result;
}